

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int32_suite::fail_array32_int32_missing_six(void)

{
  value_type input [7];
  decoder decoder;
  undefined4 local_40;
  value local_3c;
  uchar local_38 [8];
  decoder local_30;
  
  local_38[4] = '\0';
  local_38[5] = '\x11';
  local_38[6] = '\"';
  local_38[0] = 0xcc;
  local_38[1] = '\b';
  local_38[2] = '\0';
  local_38[3] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[7]>
            (&local_30,(uchar (*) [7])local_38);
  local_3c = local_30.current.code;
  local_40 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x95f,"void compact_int32_suite::fail_array32_int32_missing_six()",&local_3c,&local_40
            );
  return;
}

Assistant:

void fail_array32_int32_missing_six()
{
    const value_type input[] = { token::code::array32_int32, 0x08, 0x00, 0x00, 0x00, 0x11, 0x22 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}